

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void kratos::GeneratorPortVisitor::process_port(Generator *generator,Port *port,string *port_name)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  string *var_name;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Generator *pGVar7;
  undefined4 extraout_var_02;
  long lVar8;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Var *pVVar9;
  const_iterator cVar10;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  InternalException *this_01;
  GeneratorException *pGVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 new_var [8];
  __shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *__r;
  long *plVar12;
  shared_ptr<kratos::PortPackedStruct> sVar13;
  basic_string_view<char> bVar14;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  undefined1 local_c8 [8];
  string new_name;
  __node_base_ptr p_Stack_98;
  string *local_90;
  undefined1 local_88 [8];
  shared_ptr<kratos::Var> var;
  shared_ptr<kratos::PortPackedStruct> packed_1;
  undefined1 auStack_58 [8];
  shared_ptr<kratos::PortPackedStruct> packed;
  undefined1 local_38 [7];
  allocator_type local_31;
  
  if (port->direction_ == Out) {
    local_90 = port_name;
    iVar3 = (*(port->super_Var).super_IRNode._vptr_IRNode[0xe])(port);
    local_c8 = (undefined1  [8])&p_Stack_98;
    new_name._M_dataplus._M_p = (pointer)0x1;
    new_name._M_string_length = 0;
    new_name.field_2._M_allocated_capacity = 0;
    new_name.field_2._8_4_ = 0x3f800000;
    p_Stack_98 = (__node_base_ptr)0x0;
    plVar12 = (long *)(CONCAT44(extraout_var_01,iVar3) + 0x10);
    while (var_name = local_90, plVar12 = (long *)*plVar12, plVar12 != (long *)0x0) {
      pGVar7 = Stmt::generator_parent((Stmt *)plVar12[1]);
      iVar3 = (*(port->super_Var).super_IRNode._vptr_IRNode[0xd])(port);
      if (pGVar7 == *(Generator **)(CONCAT44(extraout_var_02,iVar3) + 0x2d0)) {
        std::
        _Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::_M_emplace<std::shared_ptr<kratos::AssignStmt>const&>
                  ((_Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_c8,plVar12 + 1);
      }
    }
    if (new_name.field_2._M_allocated_capacity != 0) {
      if (new_name.field_2._M_allocated_capacity == 1) {
        std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)auStack_58,
                   (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)
                   (new_name._M_string_length + 8));
        pVVar9 = *(Var **)((long)auStack_58 + 0xc0);
        iVar3 = (*(pVVar9->super_IRNode)._vptr_IRNode[0x1d])(pVVar9);
        bVar2 = true;
        if ((char)iVar3 == '\0') {
          bVar2 = correct_src_type(pVVar9,generator);
        }
        lVar8 = (**(code **)(*(long *)auStack_58 + 0x20))();
        if (bVar2 == true && *(int *)(lVar8 + 0x48) == 0) {
          iVar3 = (*(pVVar9->super_IRNode)._vptr_IRNode[0xd])(pVVar9);
          iVar5 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
          if ((CONCAT44(extraout_var_03,iVar3) == CONCAT44(extraout_var_04,iVar5)) &&
             ((Port *)((__node_base *)((long)auStack_58 + 200))->_M_nxt == port)) {
            (**(code **)(*(long *)auStack_58 + 0x48))();
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&packed);
            goto LAB_001da7e0;
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&packed);
      }
      iVar3 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
      pGVar7 = (Generator *)CONCAT44(extraout_var_05,iVar3);
      if (pGVar7 == (Generator *)0x0) {
        pGVar11 = (GeneratorException *)__cxa_allocate_exception(0x10);
        var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(generator->name)._M_dataplus._M_p;
        packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(generator->name)._M_string_length;
        bVar14 = fmt::v7::to_string_view<char,_0>
                           ("{0}\'s parent is empty but it\'s not a top module");
        format_str_00.data_ = (char *)bVar14.size_;
        format_str_00.size_ = 0xd;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)
                 &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)auStack_58,(detail *)bVar14.data_,format_str_00,args_00);
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)local_88;
        local_88 = (undefined1  [8])generator;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                   &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   __l_00,(allocator_type *)&local_31);
        GeneratorException::GeneratorException
                  (pGVar11,(string *)auStack_58,
                   (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                   &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        __cxa_throw(pGVar11,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
      }
      Generator::get_unique_variable_name
                ((string *)auStack_58,pGVar7,&generator->instance_name,var_name);
      iVar3 = (*(port->super_Var).super_IRNode._vptr_IRNode[0x17])(port);
      if ((char)iVar3 == '\0') {
        pVVar9 = Generator::var(pGVar7,(string *)auStack_58,(port->super_Var).var_width_,
                                &(port->super_Var).size_,(port->super_Var).is_signed_);
        uVar4 = (*(port->super_Var).super_IRNode._vptr_IRNode[0x18])(port);
        (*(pVVar9->super_IRNode)._vptr_IRNode[0x19])(pVVar9,(ulong)(uVar4 & 0xff));
        pVVar9->explicit_array_ = (port->super_Var).explicit_array_;
      }
      else {
        sVar13 = Var::as<kratos::PortPackedStruct>
                           ((Var *)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
        (*(var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base[0x2e])
                  (local_88,var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,
                   sVar13.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
        Generator::var_packed
                  (pGVar7,(string *)auStack_58,(shared_ptr<kratos::PackedStruct> *)local_88);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&packed_1);
      }
      Generator::get_var((Generator *)local_88,(string *)pGVar7);
      if (pGVar7->debug == true) {
        std::
        vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
        ::
        vector<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
                  ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                    *)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (port->super_Var).super_IRNode.fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (port->super_Var).super_IRNode.fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_31);
        this_00 = &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::_M_move_assign(&((IRNode *)local_88)->fn_name_ln,this_00);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)this_00);
        var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_52a610;
        packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             CONCAT44(packed_1.
                      super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._4_4_,0x1cd);
        std::
        vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
        ::emplace_back<std::pair<char_const*,int>>
                  ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                    *)&((IRNode *)local_88)->fn_name_ln,
                   (pair<const_char_*,_int> *)
                   &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      Var::move_sink_to(&port->super_Var,(Var *)local_88,pGVar7,true);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var);
      std::__cxx11::string::~string((string *)auStack_58);
    }
LAB_001da7e0:
    std::
    _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_c8);
    return;
  }
  if (port->direction_ != In) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,"Not implement yet",(allocator<char> *)auStack_58);
    InternalException::InternalException(this_01,(string *)local_c8);
    __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = (*(port->super_Var).super_IRNode._vptr_IRNode[0x10])(port);
  if (*(long *)(CONCAT44(extraout_var,iVar3) + 0x18) == 1) {
    lVar8 = *(long *)(CONCAT44(extraout_var,iVar3) + 0x10);
    lVar6 = (**(code **)(**(long **)(lVar8 + 8) + 0x20))();
    if (*(int *)(lVar6 + 0x48) == 0) {
      __r = (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)(lVar8 + 8);
      peVar1 = __r->_M_ptr;
      if ((Port *)peVar1->left_ == port) {
        pVVar9 = peVar1->right_;
        bVar2 = correct_src_type(pVVar9,generator);
        if (bVar2) {
LAB_001da814:
          iVar3 = (*(pVVar9->super_IRNode)._vptr_IRNode[0xd])(pVVar9);
          std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<kratos::AssignStmt,void>
                    ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)local_c8,__r);
          Generator::remove_stmt
                    ((Generator *)CONCAT44(extraout_var_06,iVar3),
                     (shared_ptr<kratos::Stmt> *)local_c8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&new_name);
          return;
        }
        if (pVVar9->type_ == Slice) {
          iVar3 = (*(pVVar9->super_IRNode)._vptr_IRNode[0xd])(pVVar9);
          local_90 = port_name;
          iVar5 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
          port_name = local_90;
          if (CONCAT44(extraout_var_07,iVar3) == CONCAT44(extraout_var_08,iVar5)) goto LAB_001da814;
        }
      }
    }
  }
  iVar3 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
  pGVar7 = (Generator *)CONCAT44(extraout_var_00,iVar3);
  if (pGVar7 != (Generator *)0x0) {
    Generator::get_unique_variable_name
              ((string *)local_c8,pGVar7,&generator->instance_name,port_name);
    iVar3 = (*(port->super_Var).super_IRNode._vptr_IRNode[0x17])(port);
    if ((char)iVar3 == '\0') {
      pVVar9 = Generator::var(pGVar7,(string *)local_c8,(port->super_Var).var_width_,
                              &(port->super_Var).size_,(port->super_Var).is_signed_);
      uVar4 = (*(port->super_Var).super_IRNode._vptr_IRNode[0x18])(port);
      (*(pVVar9->super_IRNode)._vptr_IRNode[0x19])(pVVar9,(ulong)(uVar4 & 0xff));
      pVVar9->explicit_array_ = (port->super_Var).explicit_array_;
    }
    else {
      sVar13 = Var::as<kratos::PortPackedStruct>((Var *)auStack_58);
      (**(code **)(*(long *)auStack_58 + 0x170))
                (&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 auStack_58,
                 sVar13.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      Generator::var_packed
                (pGVar7,(string *)local_c8,
                 (shared_ptr<kratos::PackedStruct> *)
                 &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&packed_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&packed);
    }
    Generator::get_var((Generator *)auStack_58,(string *)pGVar7);
    new_var = auStack_58;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&packed);
    if ((process_port(kratos::Generator*,kratos::Port*,std::__cxx11::string_const&)::cast_maps ==
         '\0') &&
       (iVar3 = __cxa_guard_acquire(&process_port(kratos::Generator*,kratos::Port*,std::__cxx11::string_const&)
                                     ::cast_maps), iVar3 != 0)) {
      packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x500000003;
      auStack_58 = (undefined1  [8])0x200000001;
      packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x300000002;
      std::
      _Hashtable<kratos::PortType,std::pair<kratos::PortType_const,kratos::VarCastType>,std::allocator<std::pair<kratos::PortType_const,kratos::VarCastType>>,std::__detail::_Select1st,std::equal_to<kratos::PortType>,std::hash<kratos::PortType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<kratos::PortType_const,kratos::VarCastType>const*>
                ((_Hashtable<kratos::PortType,std::pair<kratos::PortType_const,kratos::VarCastType>,std::allocator<std::pair<kratos::PortType_const,kratos::VarCastType>>,std::__detail::_Select1st,std::equal_to<kratos::PortType>,std::hash<kratos::PortType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&process_port::cast_maps,auStack_58,local_38,0,
                 &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 local_88,&local_31);
      __cxa_atexit(std::
                   unordered_map<kratos::PortType,_kratos::VarCastType,_std::hash<kratos::PortType>,_std::equal_to<kratos::PortType>,_std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>_>
                   ::~unordered_map,&process_port::cast_maps,&__dso_handle);
      __cxa_guard_release(&process_port(kratos::Generator*,kratos::Port*,std::__cxx11::string_const&)
                           ::cast_maps);
    }
    auStack_58._0_4_ = port->type_;
    cVar10 = std::
             _Hashtable<kratos::PortType,_std::pair<const_kratos::PortType,_kratos::VarCastType>,_std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>,_std::__detail::_Select1st,_std::equal_to<kratos::PortType>,_std::hash<kratos::PortType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&process_port::cast_maps._M_h,(key_type *)auStack_58);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_kratos::PortType,_kratos::VarCastType>,_false>.
        _M_cur != (__node_type *)0x0) {
      var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
           port->type_;
      std::__detail::
      _Map_base<kratos::PortType,_std::pair<const_kratos::PortType,_kratos::VarCastType>,_std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>,_std::__detail::_Select1st,_std::equal_to<kratos::PortType>,_std::hash<kratos::PortType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::at((_Map_base<kratos::PortType,_std::pair<const_kratos::PortType,_kratos::VarCastType>,_std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>,_std::__detail::_Select1st,_std::equal_to<kratos::PortType>,_std::hash<kratos::PortType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            *)&process_port::cast_maps,
           (key_type *)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      Var::cast((Var *)auStack_58,new_var._0_4_);
      new_var = auStack_58;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&packed);
    }
    if (pGVar7->debug == true) {
      std::
      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
      ::
      vector<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                  *)auStack_58,
                 (port->super_Var).super_IRNode.fn_name_ln.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (port->super_Var).super_IRNode.fn_name_ln.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (allocator_type *)
                 &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      this = &(((Var *)new_var)->super_IRNode).fn_name_ln;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::_M_move_assign(this,(vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)auStack_58);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)auStack_58);
      auStack_58 = (undefined1  [8])0x224e6b;
      packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._4_4_,0x194);
      std::
      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::pair<char_const*,int>>
                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                  *)this,(pair<const_char_*,_int> *)auStack_58);
    }
    Var::move_src_to(&port->super_Var,(Var *)new_var,pGVar7,true);
    std::__cxx11::string::~string((string *)local_c8);
    return;
  }
  pGVar11 = (GeneratorException *)__cxa_allocate_exception(0x10);
  auStack_58 = (undefined1  [8])(generator->name)._M_dataplus._M_p;
  packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(generator->name)._M_string_length;
  bVar14 = fmt::v7::to_string_view<char,_0>("{0}\'s parent is empty but it\'s not a top module");
  format_str.data_ = (char *)bVar14.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)auStack_58;
  fmt::v7::detail::vformat_abi_cxx11_((string *)local_c8,(detail *)bVar14.data_,format_str,args);
  __l._M_len = 1;
  __l._M_array = (iterator)
                 &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)generator;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
            ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58,__l,
             (allocator_type *)local_88);
  GeneratorException::GeneratorException
            (pGVar11,(string *)local_c8,
             (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58);
  __cxa_throw(pGVar11,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void process_port(Generator* generator, Port* port, const std::string& port_name) {
        auto const port_direction = port->port_direction();
        if (port_direction == PortDirection::In) {
            const auto& sources = port->sources();
            // unless it's driven by a single var or port, we need to duplicate
            // the variable
            if (sources.size() == 1) {
                const auto& stmt = *sources.begin();
                if (stmt->parent()->ir_node_kind() == IRNodeKind::GeneratorKind &&
                    stmt->left() == port) {
                    // the sink has to be it self
                    auto* src = stmt->right();
                    if (correct_src_type(src, generator) ||
                        // here we are okay with input sliced in
                        (src->type() == VarType::Slice &&
                         src->generator() == generator->parent())) {
                        // remove it from the parent generator
                        src->generator()->remove_stmt(stmt);
                        return;
                    }
                }
            }
            // create a new variable
            auto* ast_parent = generator->parent();
            if (!ast_parent)
                throw GeneratorException(
                    ::format("{0}'s parent is empty but it's not a top module", generator->name),
                    {generator});
            auto* parent = reinterpret_cast<Generator*>(ast_parent);
            auto new_name = parent->get_unique_variable_name(generator->instance_name, port_name);
            if (port->is_struct()) {
                auto packed = port->as<PortPackedStruct>();
                parent->var_packed(new_name, packed->packed_struct());
            } else {
                auto& v = parent->var(new_name, port->var_width(), port->size(), port->is_signed());
                v.set_is_packed(port->is_packed());
                v.set_explicit_array(port->explicit_array());
            }
            Var* var = parent->get_var(new_name).get();
            // be careful about the port type. if it's special type, it needs properly casted
            const static std::unordered_map<PortType, VarCastType> cast_maps = {
                {PortType::Clock, VarCastType::Clock},
                {PortType::AsyncReset, VarCastType::AsyncReset},
                {PortType::Reset, VarCastType::Reset},
                {PortType::ClockEnable, VarCastType::ClockEnable}};
            if (cast_maps.find(port->port_type()) != cast_maps.end()) {
                var = var->cast(cast_maps.at(port->port_type())).get();
            }
            if (parent->debug) {
                // need to copy over the changes over
                var->fn_name_ln = std::vector<std::pair<std::string, uint32_t>>(
                    port->fn_name_ln.begin(), port->fn_name_ln.end());
                var->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
            // replace all the sources
            Var::move_src_to(port, var, parent, true);
        } else if (port_direction == PortDirection::Out) {
            // same logic as the port dir in
            // if we're connected to a base variable, we are good
            const auto& sinks_ = port->sinks();
            // we are only interested in parent level port connection
            std::unordered_set<std::shared_ptr<AssignStmt>> sinks;
            for (auto const& stmt : sinks_) {
                if (stmt->generator_parent() == port->generator()->parent_generator())
                    sinks.emplace(stmt);
            }
            if (sinks.empty()) {
                return;
            }
            // special case where if the sink is parent's port, this is fine
            if (sinks.size() == 1) {
                auto stmt = *(sinks.begin());
                auto* src = stmt->left();
                bool correct_src_type_;
                if (!src->is_interface()) {
                    // as long as it is not an expression, it is fine
                    correct_src_type_ = correct_src_type(src, generator);
                } else {
                    correct_src_type_ = true;
                }
                if (stmt->parent()->ir_node_kind() == IRNodeKind::GeneratorKind &&
                    correct_src_type_ && src->generator() == generator->parent() &&
                    stmt->right() == port) {
                    // remove it from the parent generator
                    stmt->remove_from_parent();
                    return;
                }
            }
            // create a new variable
            auto* ast_parent = generator->parent();
            if (!ast_parent)
                throw GeneratorException(
                    ::format("{0}'s parent is empty but it's not a top module", generator->name),
                    {generator});
            auto* parent = reinterpret_cast<Generator*>(ast_parent);
            auto new_name = parent->get_unique_variable_name(generator->instance_name, port_name);
            if (port->is_struct()) {
                auto packed = port->as<PortPackedStruct>();
                parent->var_packed(new_name, packed->packed_struct());
            } else {
                auto& v = parent->var(new_name, port->var_width(), port->size(), port->is_signed());
                v.set_is_packed(port->is_packed());
                v.set_explicit_array(port->explicit_array());
            }
            auto var = parent->get_var(new_name);
            if (parent->debug) {
                // need to copy over the changes over
                var->fn_name_ln = std::vector<std::pair<std::string, uint32_t>>(
                    port->fn_name_ln.begin(), port->fn_name_ln.end());
                var->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
            // replace all the sources
            Var::move_sink_to(port, var.get(), parent, true);
        } else {
            throw InternalException("Not implement yet");
        }
    }